

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)116,(moira::Mode)2,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  Ea<(moira::Mode)2,_1> src;
  u32 local_14;
  ushort local_10;
  
  local_10 = op & 7;
  local_14 = *addr;
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = 's';
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = 'f';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar2 = str->ptr;
    do {
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
      pcVar2 = str->ptr;
    } while (pcVar2 < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_1> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src;
}